

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O3

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_front_by_singe_char_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_front_by_singe_char_Test<char32_t> *this)

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_R9;
  AssertionResult iutest_ar;
  b_str_view<char32_t> re;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_1a0;
  undefined1 local_190 [128];
  ios_base local_110 [264];
  
  local_1a0._M_len = 0x18;
  local_1a0._M_str = L"std::basic_istream<char, std::char_traits<char> >";
  local_190._0_8_ = 0x18;
  local_190._8_8_ = L"std::basic_istream<char,";
  iutest::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            (&local_1f8,
             (internal *)
             "std::basic_string_view<char_type>(constant::cpp_basic_istream_part<char_type>())","re"
             ,local_190,&local_1a0,in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x16;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_front_by_singe_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_basic_istream<char_type>();
	const auto re = s | split(constant::space<char_type>()) >> front();
	IUTEST_ASSERT_EQ(std::basic_string_view<char_type>(constant::cpp_basic_istream_part<char_type>()), re);
}